

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O3

bool __thiscall tinyusdz::Stage::add_root_prim(Stage *this,Prim *prim,bool rename_prim_name)

{
  multiset<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  Path *this_01;
  pointer pcVar2;
  bool bVar3;
  size_type sVar4;
  ostream *poVar5;
  char *in_RCX;
  undefined7 in_register_00000011;
  ulong uVar6;
  pointer pPVar7;
  char *pcVar8;
  undefined4 uVar9;
  long lVar10;
  string unique_name;
  string elementName;
  ostringstream ss_e;
  string local_238;
  string local_218;
  key_type local_1f8;
  undefined4 local_1d4;
  Path *local_1d0;
  undefined1 local_1c8 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  _Alloc_hider local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118 [12];
  long *local_50 [2];
  long local_40 [2];
  
  uVar9 = (undefined4)CONCAT71(in_register_00000011,rename_prim_name);
  this_01 = &prim->_elementPath;
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  pcVar2 = (prim->_elementPath)._prim_part._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1f8,pcVar2,pcVar2 + (prim->_elementPath)._prim_part._M_string_length);
  if (local_1f8._M_string_length == 0) {
    if (rename_prim_name) {
      in_RCX = "default";
      ::std::__cxx11::string::_M_replace((ulong)&local_1f8,0,(char *)0x0,0x399e75);
      bVar3 = SetPrimElementName(&prim->_data,&local_1f8);
      if (bVar3) {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"");
        Path::Path((Path *)local_1c8,&local_1f8,&local_238);
        Path::operator=(this_01,(Path *)local_1c8);
        if (local_128._M_p != local_1c8 + 0xb0) {
          operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
        }
        if (local_148._M_p != local_1c8 + 0x90) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
          operator_delete((void *)local_1c8._96_8_,local_158._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
          operator_delete((void *)local_1c8._64_8_,local_1c8._80_8_ + 1);
        }
        if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
          operator_delete((void *)local_1c8._32_8_,local_1c8._48_8_ + 1);
        }
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                   local_238.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00304962;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x27d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "Internal error. cannot modify Prim\'s elementName";
      lVar10 = 0x30;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x281);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pcVar8 = "Prim has empty elementName.";
      lVar10 = 0x1b;
    }
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar8,lVar10);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_238._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
LAB_00305377:
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
LAB_00305384:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
    ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
  }
  else {
LAB_00304962:
    this_00 = &this->_root_node_nameSet;
    local_1d4 = uVar9;
    local_1d0 = this_01;
    if (((long)(this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start >> 4) * 0x21cfb2b78c13521d -
        (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&this_00->_M_t,
                 (_Link_type)
                 (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
      p_Var1 = &(this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header;
      in_RCX = (char *)0x0;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (this->_root_node_nameSet)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      pPVar7 = (this->_root_nodes).
               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->_root_nodes).super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
          _M_impl.super__Vector_impl_data._M_finish != pPVar7) {
        lVar10 = 0x1a0;
        uVar6 = 0;
        do {
          if (*(long *)((long)&(pPVar7->_abs_path)._prim_part._M_string_length + lVar10) == 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                       ,0x4f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"add_root_prim",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x28a);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            pcVar8 = "Internal error: Existing root Prim\'s elementName is empty.";
            lVar10 = 0x3a;
LAB_00305323:
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,pcVar8,lVar10)
            ;
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_238._M_dataplus._M_p)
            ;
            bVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p == &local_238.field_2;
            goto LAB_00305370;
          }
          sVar4 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(&this_00->_M_t,
                          (key_type *)
                          ((long)&(pPVar7->_abs_path)._prim_part._M_dataplus._M_p + lVar10));
          if (sVar4 != 0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc"
                       ,0x4f);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1c8,"add_root_prim",0xd);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x28e);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            pcVar8 = "Internal error: Stage contains root Prim with same elementName.";
            lVar10 = 0x3f;
            goto LAB_00305323;
          }
          ::std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_equal<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((this->_root_nodes).
                               super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
                               _M_impl.super__Vector_impl_data._M_start)->_abs_path)._prim_part +
                     lVar10));
          uVar6 = uVar6 + 1;
          pPVar7 = (this->_root_nodes).
                   super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar10 = lVar10 + 0x350;
        } while (uVar6 < (ulong)(((long)(this->_root_nodes).
                                        super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar7 >>
                                 4) * 0x21cfb2b78c13521d));
      }
    }
    sVar4 = ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this_00->_M_t,&local_1f8);
    if (sVar4 == 0) {
LAB_00304bd1:
      ::std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_equal<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,&local_1f8);
      ::std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::emplace_back<tinyusdz::Prim>
                (&this->_root_nodes,prim);
      this->_dirty = true;
      bVar3 = true;
      goto LAB_003053a4;
    }
    if ((char)local_1d4 == '\0') {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2a4);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_218,"Prim name(elementName) {} already exists in children.\n","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_238,(fmt *)&local_218,&local_1d0->_prim_part,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_238._M_dataplus._M_p,local_238._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,
                        CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                 local_238.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_238._M_dataplus._M_p);
      bVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p == &local_238.field_2;
LAB_00305370:
      if (!bVar3) goto LAB_00305377;
      goto LAB_00305384;
    }
    local_238._M_string_length = 0;
    local_238.field_2._M_local_buf[0] = '\0';
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
    bVar3 = makeUniqueName(this_00,&local_1f8,&local_238);
    if (bVar3) {
      ::std::__cxx11::string::_M_assign((string *)&local_1f8);
      bVar3 = SetPrimElementName(&prim->_data,&local_1f8);
      if (bVar3) {
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
        Path::Path((Path *)local_1c8,&local_1f8,&local_218);
        Path::operator=(local_1d0,(Path *)local_1c8);
        if (local_128._M_p != local_1c8 + 0xb0) {
          operator_delete(local_128._M_p,local_118[0]._M_allocated_capacity + 1);
        }
        if (local_148._M_p != local_1c8 + 0x90) {
          operator_delete(local_148._M_p,local_138._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1c8._96_8_ != local_1c8 + 0x70) {
          operator_delete((void *)local_1c8._96_8_,local_158._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_1c8._64_8_ != local_1c8 + 0x50) {
          operator_delete((void *)local_1c8._64_8_,local_1c8._80_8_ + 1);
        }
        if ((undefined1 *)local_1c8._32_8_ != local_1c8 + 0x30) {
          operator_delete((void *)local_1c8._32_8_,local_1c8._48_8_ + 1);
        }
        if ((undefined1 *)local_1c8._0_8_ != local_1c8 + 0x10) {
          operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                   local_238.field_2._M_local_buf[0]) + 1);
        }
        goto LAB_00304bd1;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x2a0);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,"Internal error. cannot modify Prim\'s elementName.",0x31);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\n",1);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_218._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/stage.cc",
                 0x4f);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"add_root_prim",0xd)
      ;
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"():",3);
      poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1c8,0x299);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      local_50[0] = local_40;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Internal error. cannot assign unique name for `{}`.\n","");
      fmt::format<std::__cxx11::string>
                ((string *)&local_218,(fmt *)local_50,(string *)&local_1f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RCX);
      poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1c8,local_218._M_dataplus._M_p,local_218._M_string_length
                         );
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_218._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
      ::std::ios_base::~ios_base((ios_base *)(local_1c8 + 0x70));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,
                      CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                               local_238.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar3 = false;
LAB_003053a4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
  }
  return bVar3;
}

Assistant:

bool Stage::add_root_prim(Prim &&prim, bool rename_prim_name) {

#if defined(TINYUSDZ_ENABLE_THREAD)
  // TODO: Only take a lock when dirty.
  std::lock_guard<std::mutex> lock(_mutex);
#endif


  std::string elementName = prim.element_name();

  if (elementName.empty()) {
    if (rename_prim_name) {

      // assign default name `default`
      elementName = "default";

      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN("Prim has empty elementName.");
    }
  }

  if (_root_nodes.size() != _root_node_nameSet.size()) {
    // Rebuild nameSet
    _root_node_nameSet.clear();
    for (size_t i = 0; i < _root_nodes.size(); i++) {
      if (_root_nodes[i].element_name().empty()) {
        PUSH_ERROR_AND_RETURN("Internal error: Existing root Prim's elementName is empty.");
      }

      if (_root_node_nameSet.count(_root_nodes[i].element_name())) {
        PUSH_ERROR_AND_RETURN("Internal error: Stage contains root Prim with same elementName.");
      }

      _root_node_nameSet.insert(_root_nodes[i].element_name());
    }
  }

  if (_root_node_nameSet.count(elementName)) {
    if (rename_prim_name) {
      std::string unique_name;
      if (!makeUniqueName(_root_node_nameSet, elementName, &unique_name)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. cannot assign unique name for `{}`.\n", elementName));
      }

      elementName = unique_name;

      // Need to modify both Prim::data::name and Prim::elementPath
      if (!SetPrimElementName(prim.get_data(), elementName)) {
        PUSH_ERROR_AND_RETURN("Internal error. cannot modify Prim's elementName.");
      }
      prim.element_path() = Path(elementName, /* prop_part */"");
    } else {
      PUSH_ERROR_AND_RETURN(fmt::format("Prim name(elementName) {} already exists in children.\n", prim.element_name()));
    }
  }


  _root_node_nameSet.insert(elementName);
  _root_nodes.emplace_back(std::move(prim));

  _dirty = true;

  return true;


}